

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkCollapse(Abc_Ntk_t *pNtk,int fBddSizeMax,int fDualRail,int fReorder,int fReverse,
               int fDumpOrder,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  void *pvVar5;
  DdManager *dd_00;
  abctime aVar6;
  Abc_Ntk_t *pAVar7;
  DdManager *dd;
  abctime clk;
  Abc_Ntk_t *pNtkNew;
  int fDumpOrder_local;
  int fReverse_local;
  int fReorder_local;
  int fDualRail_local;
  int fBddSizeMax_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar4 = Abc_Clock();
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                  ,0xd4,"Abc_Ntk_t *Abc_NtkCollapse(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  pvVar5 = Abc_NtkBuildGlobalBdds(pNtk,fBddSizeMax,1,fReorder,fReverse,fVerbose);
  if (pvVar5 == (void *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (fVerbose != 0) {
      dd_00 = (DdManager *)Abc_NtkGlobalBddMan(pNtk);
      uVar2 = Cudd_ReadKeys(dd_00);
      uVar3 = Cudd_ReadDead(dd_00);
      printf("Shared BDD size = %6d nodes.  ",(ulong)(uVar2 - uVar3));
      Abc_Print(1,"%s =","BDD construction time");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar4) * 1.0) / 1000000.0);
    }
    if (fDumpOrder != 0) {
      Abc_NtkDumpVariableOrder(pNtk);
    }
    pNtk_local = Abc_NtkFromGlobalBdds(pNtk,fReverse);
    Abc_NtkFreeGlobalBdds(pNtk,1);
    if (pNtk_local == (Abc_Ntk_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      Abc_NtkMinimumBase2(pNtk_local);
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar7 = Abc_NtkDup(pNtk->pExdc);
        pNtk_local->pExdc = pAVar7;
      }
      iVar1 = Abc_NtkCheck(pNtk_local);
      if (iVar1 == 0) {
        printf("Abc_NtkCollapse: The network check has failed.\n");
        Abc_NtkDelete(pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkCollapse( Abc_Ntk_t * pNtk, int fBddSizeMax, int fDualRail, int fReorder, int fReverse, int fDumpOrder, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, fBddSizeMax, 1, fReorder, fReverse, fVerbose) == NULL )
        return NULL;
    if ( fVerbose )
    {
        DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
        printf( "Shared BDD size = %6d nodes.  ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
        ABC_PRT( "BDD construction time", Abc_Clock() - clk );
    }
    if ( fDumpOrder ) 
        Abc_NtkDumpVariableOrder( pNtk );

    // create the new network
    pNtkNew = Abc_NtkFromGlobalBdds( pNtk, fReverse );
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    if ( pNtkNew == NULL )
        return NULL;

    // make the network minimum base
    Abc_NtkMinimumBase2( pNtkNew );

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCollapse: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}